

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O2

void __thiscall
sisl::array_n<float,_2,_std::allocator<float>_>::array_n
          (array_n<float,_2,_std::allocator<float>_> *this,uint d0,...)

{
  va_list vl;
  uint local_a8;
  
  this->_dims[0] = d0;
  this->_dims[1] = local_a8;
  _alloc(this,d0 * local_a8);
  return;
}

Assistant:

array_n(unsigned int d0, ...) {
            unsigned int n = d0;
            size_type i;

            // Start with d0
            va_list vl;
            va_start(vl, d0);

            _dims[0] = d0;

            for(int i = 1; i < N; i++) {
                _dims[i] = va_arg(vl, unsigned int);
                n *= _dims[i];
            }
            va_end(vl);
            _alloc(n);
#ifdef SISL_CL
            _onDevice = false;
            _deviceMemory = nullptr;
#endif
        }